

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntryNode.cpp
# Opt level: O2

void __thiscall EntryNode::EntryNode(EntryNode *this)

{
  _Rb_tree_header *p_Var1;
  
  Node::Node(&this->super_Node,ENTRY,(Instruction *)0x0,(CallInst *)0x0);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__EntryNode_0013abb0;
  p_Var1 = &(this->forkPredecessors_)._M_t._M_impl.super__Rb_tree_header;
  (this->forkPredecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->forkPredecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->forkPredecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->forkPredecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->forkPredecessors_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

EntryNode::EntryNode() : Node(NodeType::ENTRY) {}